

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::writeSysexGlobal(Synth *this,Bit32u addr,Bit8u *sysex,Bit32u len)

{
  Bit32u BVar1;
  MemoryRegion *this_00;
  Bit32u next;
  MemoryRegion *region;
  Bit8u *pBStack_20;
  Bit32u len_local;
  Bit8u *sysex_local;
  Bit32u addr_local;
  Synth *this_local;
  
  region._4_4_ = len;
  pBStack_20 = sysex;
  sysex_local._4_4_ = addr;
  while( true ) {
    this_00 = findMemoryRegion(this,sysex_local._4_4_);
    if (this_00 == (MemoryRegion *)0x0) {
      printDebug(this,"Sysex write to unrecognised address %06x, len %d",
                 (ulong)((sysex_local._4_4_ & 0x1fc000) << 2 | (sysex_local._4_4_ & 0x3f80) << 1 |
                        sysex_local._4_4_ & 0x7f),(ulong)region._4_4_);
      return;
    }
    BVar1 = MemoryRegion::getClampedLen(this_00,sysex_local._4_4_,region._4_4_);
    writeMemoryRegion(this,this_00,sysex_local._4_4_,BVar1,pBStack_20);
    BVar1 = MemoryRegion::next(this_00,sysex_local._4_4_,region._4_4_);
    if (BVar1 == 0) break;
    sysex_local._4_4_ = BVar1 + sysex_local._4_4_;
    pBStack_20 = pBStack_20 + BVar1;
    region._4_4_ = region._4_4_ - BVar1;
  }
  return;
}

Assistant:

void Synth::writeSysexGlobal(Bit32u addr, const Bit8u *sysex, Bit32u len) {
	for (;;) {
		// Find the appropriate memory region
		const MemoryRegion *region = findMemoryRegion(addr);

		if (region == NULL) {
			printDebug("Sysex write to unrecognised address %06x, len %d", MT32EMU_SYSEXMEMADDR(addr), len);
			// FIXME: Real devices may respond differently to a long SysEx that covers adjacent regions.
			break;
		}
		writeMemoryRegion(region, addr, region->getClampedLen(addr, len), sysex);

		Bit32u next = region->next(addr, len);
		if (next == 0) {
			break;
		}
		addr += next;
		sysex += next;
		len -= next;
	}
}